

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
ModbusSimulationDataGenerator::Initialize
          (ModbusSimulationDataGenerator *this,U32 simulation_sample_rate,
          ModbusAnalyzerSettings *settings)

{
  uint uVar1;
  int iVar2;
  uint local_28;
  U32 i;
  U32 num_bits;
  ModbusAnalyzerSettings *settings_local;
  U32 simulation_sample_rate_local;
  ModbusSimulationDataGenerator *this_local;
  
  this->mSimulationSampleRateHz = simulation_sample_rate;
  this->mSettings = settings;
  iVar2 = (int)this;
  ClockGenerator::Init((double)this->mSettings->mBitRate,iVar2 + 0x28);
  SimulationChannelDescriptor::SetChannel((Channel *)&this->mModbusSimulationData);
  SimulationChannelDescriptor::SetSampleRate(iVar2 + 0x30);
  if ((this->mSettings->mInverted & 1U) == 0) {
    this->mBitLow = BIT_LOW;
    this->mBitHigh = BIT_HIGH;
  }
  else {
    this->mBitLow = BIT_HIGH;
    this->mBitHigh = BIT_LOW;
  }
  SimulationChannelDescriptor::SetInitialBitState(iVar2 + 0x30);
  ClockGenerator::AdvanceByHalfPeriod(10.0);
  SimulationChannelDescriptor::Advance(iVar2 + 0x30);
  this->mValue = 0;
  this->mNumBitsMask = 0;
  uVar1 = this->mSettings->mBitsPerTransfer;
  for (local_28 = 0; local_28 < uVar1; local_28 = local_28 + 1) {
    this->mNumBitsMask = this->mNumBitsMask << 1;
    this->mNumBitsMask = this->mNumBitsMask | 1;
  }
  init_crc16_tab(this);
  return;
}

Assistant:

void ModbusSimulationDataGenerator::Initialize( U32 simulation_sample_rate, ModbusAnalyzerSettings* settings )
{
    mSimulationSampleRateHz = simulation_sample_rate;
    mSettings = settings;

    mClockGenerator.Init( mSettings->mBitRate, simulation_sample_rate );
    mModbusSimulationData.SetChannel( mSettings->mInputChannel );
    mModbusSimulationData.SetSampleRate( simulation_sample_rate );

    if( mSettings->mInverted == false )
    {
        mBitLow = BIT_LOW;
        mBitHigh = BIT_HIGH;
    }
    else
    {
        mBitLow = BIT_HIGH;
        mBitHigh = BIT_LOW;
    }

    mModbusSimulationData.SetInitialBitState( mBitHigh );
    mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

    mValue = 0;
    mNumBitsMask = 0;

    U32 num_bits = mSettings->mBitsPerTransfer;
    for( U32 i = 0; i < num_bits; i++ )
    {
        mNumBitsMask <<= 1;
        mNumBitsMask |= 0x1;
    }

    // used for calculating Modbus Checksum values
    init_crc16_tab();
}